

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

void __thiscall Tigre::String::urlDecode(String *this)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  undefined8 uVar4;
  String local_130;
  String local_110;
  string local_f0 [32];
  String local_d0;
  String local_b0;
  String local_90;
  String local_60;
  char local_3c [4];
  int local_38;
  int ii;
  int i;
  char ch;
  String ret;
  String *this_local;
  
  ret.value.field_2._8_8_ = this;
  String((String *)&i);
  String(&local_60,"+");
  String(&local_90," ");
  replace(this,&local_60,&local_90);
  ~String(&local_90);
  ~String(&local_60);
  String(&local_b0,"%2B");
  String(&local_d0,"+");
  replace(this,&local_b0,&local_d0);
  ~String(&local_d0);
  ~String(&local_b0);
  local_38 = 0;
  while( true ) {
    iVar1 = local_38;
    iVar2 = Count(this);
    if (iVar2 <= iVar1) break;
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)this);
    if (*pcVar3 == '%') {
      std::__cxx11::string::substr((ulong)local_f0,(ulong)this);
      uVar4 = std::__cxx11::string::c_str();
      __isoc99_sscanf(uVar4,"%x",local_3c);
      std::__cxx11::string::~string(local_f0);
      ii._3_1_ = local_3c[0];
      String(&local_110,(int)local_3c[0]);
      operator+=((String *)&i,&local_110);
      ~String(&local_110);
      local_38 = local_38 + 2;
    }
    else {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)this);
      String(&local_130,(int)*pcVar3);
      operator+=((String *)&i,&local_130);
      ~String(&local_130);
    }
    local_38 = local_38 + 1;
  }
  std::__cxx11::string::operator=((string *)this,(string *)&i);
  ~String((String *)&i);
  return;
}

Assistant:

void Tigre::String::urlDecode() {
    String ret;
    char ch;
    int i, ii;
    this->replace("+", " ");
    this->replace("%2B", "+");
    for (i=0; i<this->Count(); i++) {
        if (int(this->value[i])==37) {
            sscanf(this->value.substr(i+1,2).c_str(), "%x", &ii);
            ch=static_cast<char>(ii);
            ret+=ch;
            i=i+2;
        } else {
            ret+= char(this->value[i]);
        }
    }
    this->value = ret.value;
}